

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLES__technique__pass__states__scissor
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  byte bVar2;
  profile_GLES__technique__pass__states__scissor__AttributeData *ppVar3;
  StringHash SVar4;
  long *in_RSI;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_RDI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLES__technique__pass__states__scissor__AttributeData *attributeData;
  ParserChar *in_stack_00000078;
  ParserChar *in_stack_00000080;
  StringHash in_stack_00000088;
  ErrorType in_stack_00000090;
  Severity in_stack_00000094;
  ParserTemplateBase *in_stack_00000098;
  void **in_stack_ffffffffffffff98;
  ParserTemplateBase *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  ParserChar *elementHash;
  ParserTemplateBase *this_00;
  undefined8 *local_38;
  bool local_1;
  
  ppVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::profile_GLES__technique__pass__states__scissor__AttributeData>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_009f6324:
    if ((ppVar3->present_attributes & 1) == 0) {
      GeneratedSaxParser::XSList<long_long>::XSList((XSList<long_long> *)&stack0xffffffffffffff98);
      (ppVar3->value).data = (longlong *)in_stack_ffffffffffffff98;
      (ppVar3->value).size = (size_t)in_stack_ffffffffffffffa0;
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          this_00 = (ParserTemplateBase *)*local_38;
          if (this_00 == (ParserTemplateBase *)0x0) goto LAB_009f6324;
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)this_00);
          if (local_38 + 1 == (undefined8 *)0x0) {
            return false;
          }
          elementHash = (ParserChar *)local_38[1];
          local_38 = local_38 + 2;
          if (SVar4 != 0x76887d) break;
          ppVar3->param = elementHash;
        }
        if (SVar4 != 0x7c83b5) break;
        bVar1 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2Sint64List
                          (in_RDI,(ParserChar *)0x7c83b5,(XSList<long_long> *)0x9f6289);
        bVar2 = (bVar1 ^ 0xffU) & 1;
        if ((bVar2 != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)(SVar4 >> 0x20),(ErrorType)SVar4,
                               (StringHash)elementHash,
                               (CONCAT17(bVar1,in_stack_ffffffffffffffa8) ^ 0xff00000000000000) &
                               0x1ffffffffffffff,(ParserChar *)in_stack_ffffffffffffffa0), bVar1)) {
          return false;
        }
        if ((bVar2 & 1) == 0) {
          ppVar3->present_attributes = ppVar3->present_attributes | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_00000088,
                         in_stack_00000080,in_stack_00000078);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLES__technique__pass__states__scissor( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__states__scissor( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__states__scissor__AttributeData* attributeData = newData<profile_GLES__technique__pass__states__scissor__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2Sint64List(attributeValue, attributeData->value, 0, HASH_ELEMENT_SCISSOR, HASH_ATTRIBUTE_VALUE);
    }
    else
    {
failed = !characterData2Sint64List(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2Sint64List(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SCISSOR,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__int4_type(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_SCISSOR,
            HASH_ATTRIBUTE_VALUE,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__states__scissor__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_SCISSOR,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SCISSOR, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__states__scissor__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<sint64>();
}


    return true;
}